

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

string * leftJustify(string *__return_storage_ptr__,string *input,int width)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_48 [2];
  long local_38 [2];
  
  uVar3 = utf8_text_width(input);
  iVar1 = width - uVar3;
  if ((int)(width - uVar3) < 1) {
    iVar1 = 0;
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)iVar1);
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)local_48,0,(char *)0x0,(ulong)(input->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string leftJustify (const std::string& input, const int width)
{
  return input + std::string (std::max<int> (width - utf8_text_width (input), 0), ' ');
}